

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void __thiscall ccs::ParserImpl::advance(ParserImpl *this)

{
  Token local_68;
  ParserImpl *local_10;
  ParserImpl *this_local;
  
  local_10 = this;
  anon_unknown_0::Token::operator=(&this->last_,&this->cur_);
  anon_unknown_0::Lexer::consume(&local_68,&this->lex_);
  anon_unknown_0::Token::operator=(&this->cur_,&local_68);
  anon_unknown_0::Token::~Token(&local_68);
  return;
}

Assistant:

void advance() { last_ = cur_; cur_ = lex_.consume(); }